

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O0

RealType __thiscall
OpenMD::GofRTheta::evaluateAngle(GofRTheta *this,StuntDouble *sd1,StuntDouble *sd2)

{
  bool bVar1;
  undefined8 uVar2;
  Atom *in_RSI;
  StuntDouble *in_RDI;
  double dVar3;
  MultipoleAdapter ma1;
  AtomType *atype1;
  Vector3d vec;
  Vector3d r12;
  Vector3d pos2;
  Vector3d pos1;
  bool usePeriodicBoundaryConditions_;
  Vector<double,_3U> *in_stack_fffffffffffffda8;
  StuntDouble *in_stack_fffffffffffffdb0;
  Vector<double,_3U> *in_stack_fffffffffffffdc0;
  Vector<double,_3U> *in_stack_fffffffffffffdd0;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffdd8;
  SquareMatrix3<double> *in_stack_fffffffffffffde8;
  MultipoleAdapter *in_stack_fffffffffffffe18;
  Vector3d *in_stack_fffffffffffffe28;
  Snapshot *in_stack_fffffffffffffe30;
  StuntDouble local_188;
  MultipoleAdapter local_c8;
  AtomType *local_c0;
  string local_b8 [159];
  byte local_19;
  Atom *local_10;
  
  local_10 = in_RSI;
  SimInfo::getSimParams(*(SimInfo **)&in_RDI->objType_);
  local_19 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x15092d);
  StuntDouble::getPos(in_RDI);
  StuntDouble::getPos(in_RDI);
  OpenMD::operator-((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffdb0);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  if ((local_19 & 1) != 0) {
    Snapshot::wrapVector(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  }
  Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_fffffffffffffdb0);
  Vector3<double>::Vector3((Vector3<double> *)0x1509cf);
  bVar1 = StuntDouble::isDirectional(in_stack_fffffffffffffdb0);
  if (!bVar1) {
    (*(local_10->super_StuntDouble)._vptr_StuntDouble[7])(local_b8);
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"GofRTheta: attempted to use a non-directional object: %s\n",uVar2
            );
    std::__cxx11::string::~string(local_b8);
    painCave.isFatal = 1;
    simError();
  }
  bVar1 = StuntDouble::isAtom(&local_10->super_StuntDouble);
  if (bVar1) {
    local_c0 = Atom::getAtomType(local_10);
    MultipoleAdapter::MultipoleAdapter(&local_c8,local_c0);
    bVar1 = MultipoleAdapter::isDipole(in_stack_fffffffffffffe18);
    if (bVar1) {
      StuntDouble::getDipole(in_RDI);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffdb0,
                 (Vector3<double> *)in_stack_fffffffffffffda8);
    }
    else {
      in_stack_fffffffffffffdb0 = &local_188;
      StuntDouble::getA(in_RDI);
      SquareMatrix3<double>::transpose(in_stack_fffffffffffffde8);
      OpenMD::operator*(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      Vector3<double>::operator=
                ((Vector3<double> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffdb0);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x150b35);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x150b42);
    }
  }
  else {
    StuntDouble::getA(in_RDI);
    SquareMatrix3<double>::transpose(in_stack_fffffffffffffde8);
    OpenMD::operator*(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    Vector3<double>::operator=
              ((Vector3<double> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffdb0);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x150bf4);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x150bfe);
  }
  Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_fffffffffffffdb0);
  dVar3 = dot<double,3u>(in_stack_fffffffffffffdc0,(Vector<double,_3U> *)in_RDI);
  return dVar3;
}

Assistant:

RealType GofRTheta::evaluateAngle(StuntDouble* sd1, StuntDouble* sd2) {
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos2 - pos1;

    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(r12);

    r12.normalize();

    Vector3d vec;

    if (!sd1->isDirectional()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GofRTheta: attempted to use a non-directional object: %s\n",
               sd1->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    if (sd1->isAtom()) {
      AtomType* atype1     = static_cast<Atom*>(sd1)->getAtomType();
      MultipoleAdapter ma1 = MultipoleAdapter(atype1);

      if (ma1.isDipole())
        vec = sd1->getDipole();
      else
        vec = sd1->getA().transpose() * V3Z;
    } else {
      vec = sd1->getA().transpose() * V3Z;
    }

    vec.normalize();

    return dot(r12, vec);
  }